

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O1

void __thiscall t_json_generator::write_number<long>(t_json_generator *this,long n)

{
  string local_30;
  
  number_to_string<long>(&local_30,this,n);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->f_json_,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void write_number(T n) {
    f_json_ << number_to_string(n);
  }